

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.hpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesGroupInfo::addElement(XercesGroupInfo *this,SchemaElementDecl *elem)

{
  bool bVar1;
  
  bVar1 = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::containsElement
                    (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,elem);
  if (bVar1) {
    return;
  }
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::addElement
            (&this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,elem);
  return;
}

Assistant:

inline void XercesGroupInfo::addElement(SchemaElementDecl* const elem) {

    if (!fElements->containsElement(elem))
        fElements->addElement(elem);
}